

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void __thiscall jpgd::jpeg_decoder::H1V1Convert(jpeg_decoder *this)

{
  byte bVar1;
  byte bVar2;
  uint8 uVar3;
  uint uVar4;
  int cr;
  int cb;
  int y;
  int j;
  int i;
  uint8 *s;
  uint8 *d;
  int row;
  jpeg_decoder *this_local;
  
  s = this->m_pScan_line_0;
  _j = this->m_pSample_buf + (this->m_max_mcu_y_size - this->m_mcu_lines_left) * 8;
  for (y = this->m_max_mcus_per_row; 0 < y; y = y + -1) {
    for (cb = 0; cb < 8; cb = cb + 1) {
      uVar4 = (uint)_j[cb];
      bVar1 = _j[cb + 0x40];
      bVar2 = _j[cb + 0x80];
      uVar3 = clamp(uVar4 + this->m_crr[(int)(uint)bVar2]);
      *s = uVar3;
      uVar3 = clamp(uVar4 + (this->m_crg[(int)(uint)bVar2] + this->m_cbg[(int)(uint)bVar1] >> 0x10))
      ;
      s[1] = uVar3;
      uVar3 = clamp(uVar4 + this->m_cbb[(int)(uint)bVar1]);
      s[2] = uVar3;
      s[3] = 0xff;
      s = s + 4;
    }
    _j = _j + 0xc0;
  }
  return;
}

Assistant:

void jpeg_decoder::H1V1Convert()
	{
		int row = m_max_mcu_y_size - m_mcu_lines_left;
		uint8* d = m_pScan_line_0;
		uint8* s = m_pSample_buf + row * 8;

		for (int i = m_max_mcus_per_row; i > 0; i--)
		{
			for (int j = 0; j < 8; j++)
			{
				int y = s[j];
				int cb = s[64 + j];
				int cr = s[128 + j];

				d[0] = clamp(y + m_crr[cr]);
				d[1] = clamp(y + ((m_crg[cr] + m_cbg[cb]) >> 16));
				d[2] = clamp(y + m_cbb[cb]);
				d[3] = 255;

				d += 4;
			}

			s += 64 * 3;
		}
	}